

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathSumFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlXPathObjectPtr pxVar2;
  xmlNodeSetPtr pxVar3;
  xmlXPathObjectPtr value;
  uint uVar4;
  int iVar5;
  long lVar6;
  double val;
  double dVar7;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar5 = ctxt->valueNr;
    if ((long)iVar5 < 1) {
      iVar5 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
         ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
        uVar4 = iVar5 - 1;
        ctxt->valueNr = uVar4;
        ppxVar1 = ctxt->valueTab;
        if (iVar5 == 1) {
          pxVar2 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar2 = ppxVar1[(long)iVar5 + -2];
        }
        ctxt->value = pxVar2;
        pxVar2 = ppxVar1[uVar4];
        ppxVar1[uVar4] = (xmlXPathObjectPtr)0x0;
        pxVar3 = pxVar2->nodesetval;
        val = 0.0;
        if ((pxVar3 != (xmlNodeSetPtr)0x0) && (0 < pxVar3->nodeNr)) {
          lVar6 = 0;
          do {
            dVar7 = xmlXPathNodeToNumberInternal(ctxt,pxVar3->nodeTab[lVar6]);
            val = val + dVar7;
            lVar6 = lVar6 + 1;
            pxVar3 = pxVar2->nodesetval;
          } while (lVar6 < pxVar3->nodeNr);
        }
        value = xmlXPathCacheNewFloat(ctxt,val);
        xmlXPathValuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,pxVar2);
        return;
      }
      iVar5 = 0xb;
    }
  }
  else {
    iVar5 = 0xc;
  }
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPathSumFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    int i;
    double res = 0.0;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval != NULL) && (cur->nodesetval->nodeNr != 0)) {
	for (i = 0; i < cur->nodesetval->nodeNr; i++) {
	    res += xmlXPathNodeToNumberInternal(ctxt,
                                                cur->nodesetval->nodeTab[i]);
	}
    }
    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, res));
    xmlXPathReleaseObject(ctxt->context, cur);
}